

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.h
# Opt level: O1

void __thiscall
fmt::v7::detail::ansi_color_escape<char>::ansi_color_escape
          (ansi_color_escape<char> *this,color_type text_color,char *esc)

{
  ulong uVar1;
  int i;
  long lVar2;
  uint uVar3;
  char cVar4;
  ulong uVar5;
  char *pcVar6;
  uint uVar7;
  
  if (((ulong)text_color & 1) == 0) {
    uVar5 = (ulong)text_color >> 0x20 & 0xff;
    uVar1 = (ulong)((int)uVar5 + 10);
    if (esc != "\x1b[48;2;") {
      uVar1 = uVar5;
    }
    this->buffer[0] = '\x1b';
    this->buffer[1] = '[';
    lVar2 = 2;
    uVar7 = (uint)uVar1;
    if (99 < uVar7) {
      this->buffer[2] = '1';
      uVar7 = uVar7 + (int)(uVar1 / 100) * -100;
      lVar2 = 3;
    }
    pcVar6 = this->buffer + lVar2 + 3;
    pcVar6[-3] = (byte)((ulong)uVar7 / 10) | 0x30;
    pcVar6[-2] = (char)uVar7 + ((char)(uVar7 / 10) + (char)(uVar7 / 10)) * -5 | 0x30;
    pcVar6[-1] = 'm';
  }
  else {
    lVar2 = 0;
    do {
      this->buffer[lVar2] = esc[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 7);
    uVar7 = text_color.value._2_2_ & 0xff;
    this->buffer[7] = (byte)(uVar7 * 0x29 >> 0xc) | 0x30;
    uVar7 = uVar7 / 10;
    cVar4 = (char)uVar7;
    this->buffer[8] = cVar4 + (char)(uVar7 * 0x1a >> 8) * -10 | 0x30;
    this->buffer[9] = text_color.value._2_1_ + cVar4 * -10 | 0x30;
    uVar7 = text_color.value.rgb_color >> 8 & 0xff;
    this->buffer[10] = ';';
    this->buffer[0xb] = (byte)(uVar7 * 0x29 >> 0xc) | 0x30;
    uVar7 = uVar7 / 10;
    cVar4 = (char)uVar7;
    this->buffer[0xc] = cVar4 + (char)(uVar7 * 0x1a >> 8) * -10 | 0x30;
    this->buffer[0xd] = text_color.value._1_1_ + cVar4 * -10 | 0x30;
    this->buffer[0xe] = ';';
    uVar7 = text_color.value.rgb_color & 0xff;
    uVar3 = uVar7 / 10;
    this->buffer[0xf] = (byte)(uVar7 * 0x29 >> 0xc) | 0x30;
    cVar4 = (char)uVar3;
    this->buffer[0x10] = cVar4 + (char)(uVar3 * 0x1a >> 8) * -10 | 0x30;
    this->buffer[0x11] = text_color.value._0_1_ + cVar4 * -10 | 0x30;
    this->buffer[0x12] = 'm';
    pcVar6 = this->buffer + 0x13;
  }
  *pcVar6 = '\0';
  return;
}

Assistant:

FMT_CONSTEXPR ansi_color_escape(detail::color_type text_color,
                                  const char* esc) FMT_NOEXCEPT {
    // If we have a terminal color, we need to output another escape code
    // sequence.
    if (!text_color.is_rgb) {
      bool is_background = esc == detail::data::background_color;
      uint32_t value = text_color.value.term_color;
      // Background ASCII codes are the same as the foreground ones but with
      // 10 more.
      if (is_background) value += 10u;

      size_t index = 0;
      buffer[index++] = static_cast<Char>('\x1b');
      buffer[index++] = static_cast<Char>('[');

      if (value >= 100u) {
        buffer[index++] = static_cast<Char>('1');
        value %= 100u;
      }
      buffer[index++] = static_cast<Char>('0' + value / 10u);
      buffer[index++] = static_cast<Char>('0' + value % 10u);

      buffer[index++] = static_cast<Char>('m');
      buffer[index++] = static_cast<Char>('\0');
      return;
    }

    for (int i = 0; i < 7; i++) {
      buffer[i] = static_cast<Char>(esc[i]);
    }
    rgb color(text_color.value.rgb_color);
    to_esc(color.r, buffer + 7, ';');
    to_esc(color.g, buffer + 11, ';');
    to_esc(color.b, buffer + 15, 'm');
    buffer[19] = static_cast<Char>(0);
  }